

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::intarg::test_method(intarg *this)

{
  long lVar1;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  int64_t *piVar4;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined8 local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  allocator<char> local_349;
  int64_t local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  pair<const_char_*,_ArgsManager::Flags> local_310;
  pair<const_char_*,_ArgsManager::Flags> local_300;
  string local_2f0;
  undefined1 local_2d0 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_300.first = "-foo";
  local_310.second = ALLOW_ANY;
  local_310.first = "-bar";
  local_300.second = local_310.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_2d0,&local_300);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_310);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_2f0,__l,(allocator_type *)&local_348);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  lVar2 = 0x28;
  do {
    std::__cxx11::string::~string((string *)(local_2d0 + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xfb;
  file.m_begin = (iterator)&local_320;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_330,msg);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_338 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  piVar4 = &local_348;
  local_418._0_4_ = 0xb;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_340,0xfb,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 11)",&local_418,
             "11");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xfc;
  file_00.m_begin = (iterator)&local_360;
  msg_00.m_end = (iterator)piVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_370,
             msg_00);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_378 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  piVar4 = &local_348;
  local_418._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_380,0xfc,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 0)",&local_418,"0"
            );
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo -bar",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xff;
  file_01.m_begin = (iterator)&local_390;
  msg_01.m_end = (iterator)piVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3a0,
             msg_01);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3a8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  piVar4 = &local_348;
  local_418._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_3b0,0xff,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 11)",&local_418,
             "0");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x100;
  file_02.m_begin = (iterator)&local_3c0;
  msg_02.m_end = (iterator)piVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3d0,
             msg_02);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3d8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-bar",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  piVar4 = &local_348;
  local_418 = (ulong)local_418._4_4_ << 0x20;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_3e0,0x100,1,2,piVar4,"local_args.GetIntArg(\"-bar\", 11)",&local_418,
             "0");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=-9223372036854775809 -bar=9223372036854775808",
             (allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x104;
  file_03.m_begin = (iterator)&local_3f0;
  msg_03.m_end = (iterator)piVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_400,
             msg_03);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_408 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  piVar4 = &local_348;
  local_418 = 0x8000000000000000;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_2d0,&local_410,0x104,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 0)",&local_418,
             "std::numeric_limits<int64_t>::min()");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x105;
  file_04.m_begin = (iterator)&local_428;
  msg_04.m_end = (iterator)piVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_438,
             msg_04);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_440 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-bar",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  piVar4 = &local_348;
  local_418 = 0x7fffffffffffffff;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_2d0,&local_448,0x105,1,2,piVar4,"local_args.GetIntArg(\"-bar\", 0)",&local_418,
             "std::numeric_limits<int64_t>::max()");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=11 -bar=12",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x108;
  file_05.m_begin = (iterator)&local_458;
  msg_05.m_end = (iterator)piVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_468,
             msg_05);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_470 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  piVar4 = &local_348;
  local_418._0_4_ = 0xb;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_478,0x108,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 0)",&local_418,
             "11");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x109;
  file_06.m_begin = (iterator)&local_488;
  msg_06.m_end = (iterator)piVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_498,
             msg_06);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4a0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-bar",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  piVar4 = &local_348;
  local_418._0_4_ = 0xc;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_4a8,0x109,1,2,piVar4,"local_args.GetIntArg(\"-bar\", 11)",&local_418,
             "12");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo=NaN -bar=NotANumber",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x10c;
  file_07.m_begin = (iterator)&local_4b8;
  msg_07.m_end = (iterator)piVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4c8,
             msg_07);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4d0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-foo",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,1);
  piVar4 = &local_348;
  local_418._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_4d8,0x10c,1,2,piVar4,"local_args.GetIntArg(\"-foo\", 1)",&local_418,
             "0");
  std::__cxx11::string::~string((string *)&local_2f0);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x10d;
  file_08.m_begin = (iterator)&local_4e8;
  msg_08.m_end = (iterator)piVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4f8,
             msg_08);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_500 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-bar",&local_349);
  local_348 = ArgsManager::GetIntArg(&local_args,&local_2f0,0xb);
  local_418 = (ulong)local_418._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_508,0x10d,1,2,&local_348,"local_args.GetIntArg(\"-bar\", 11)",
             &local_418,"0");
  std::__cxx11::string::~string((string *)&local_2f0);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(intarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 11), 11);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), 0);

    ResetArgs(local_args, "-foo -bar");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 11), 0);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 0);

    // Check under-/overflow behavior.
    ResetArgs(local_args, "-foo=-9223372036854775809 -bar=9223372036854775808");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), std::numeric_limits<int64_t>::min());
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 0), std::numeric_limits<int64_t>::max());

    ResetArgs(local_args, "-foo=11 -bar=12");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 0), 11);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 12);

    ResetArgs(local_args, "-foo=NaN -bar=NotANumber");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-foo", 1), 0);
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 11), 0);
}